

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constants.cpp
# Opt level: O2

Rational<scp::BigInt<unsigned_int,_unsigned_long>_> *
squareRoot(Rational<scp::BigInt<unsigned_int,_unsigned_long>_> *__return_storage_ptr__,uint64_t x,
          uint64_t n)

{
  bool bVar1;
  long lVar2;
  unsigned_long *n_00;
  long x_00;
  undefined1 auVar3 [16];
  Frac<scp::BigInt<unsigned_int,_unsigned_long>_> local_110;
  double local_c8;
  double dStack_c0;
  BigInt<unsigned_int,_unsigned_long> eps;
  BigInt<unsigned_int,_unsigned_long> lim;
  Frac<scp::BigInt<unsigned_int,_unsigned_long>_> local_70;
  
  lVar2 = 1;
  x_00 = lVar2;
  do {
    n_00 = (unsigned_long *)(lVar2 * lVar2);
    lVar2 = lVar2 + 1;
    x_00 = x_00 + 2;
  } while (n_00 < x);
  scp::BigInt<unsigned_int,_unsigned_long>::BigInt
            ((BigInt<unsigned_int,_unsigned_long> *)&local_110,x_00);
  scp::BigInt<unsigned_int,_unsigned_long>::BigInt
            ((BigInt<unsigned_int,_unsigned_long> *)&local_70,2);
  scp::Rational<scp::BigInt<unsigned_int,_unsigned_long>_>::Rational
            (__return_storage_ptr__,(BigInt<unsigned_int,_unsigned_long> *)&local_110,
             (BigInt<unsigned_int,_unsigned_long> *)&local_70);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_70);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_110);
  scp::BigInt<unsigned_int,_unsigned_long>::BigInt
            ((BigInt<unsigned_int,_unsigned_long> *)&local_110,10);
  local_70._vptr_Frac = (_func_int **)(n + 1);
  scp::pow<scp::BigInt<unsigned_int,unsigned_long>,unsigned_long>
            (&lim,(scp *)&local_110,(BigInt<unsigned_int,_unsigned_long> *)&local_70,n_00);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_110);
  scp::BigInt<unsigned_int,_unsigned_long>::BigInt(&eps,2);
  auVar3._8_4_ = (int)(x >> 0x20);
  auVar3._0_8_ = x;
  auVar3._12_4_ = 0x45300000;
  dStack_c0 = auVar3._8_8_ - 1.9342813113834067e+25;
  local_c8 = dStack_c0 + ((double)CONCAT44(0x43300000,(int)x) - 4503599627370496.0);
  while( true ) {
    bVar1 = scp::BigInt<unsigned_int,_unsigned_long>::operator<(&eps,&lim);
    if (!bVar1) break;
    scp::BigInt<unsigned_int,_unsigned_long>::operator*=(&eps,&eps);
    scp::operator*((Rational<scp::BigInt<unsigned_int,_unsigned_long>_> *)&local_110,
                   __return_storage_ptr__,__return_storage_ptr__);
    scp::Rational<scp::BigInt<unsigned_int,_unsigned_long>_>::operator+=
              ((Rational<scp::BigInt<unsigned_int,_unsigned_long>_> *)&local_110,local_c8);
    scp::operator*((Rational<scp::BigInt<unsigned_int,_unsigned_long>_> *)&local_70,2.0,
                   __return_storage_ptr__);
    scp::Rational<scp::BigInt<unsigned_int,_unsigned_long>_>::operator/=
              ((Rational<scp::BigInt<unsigned_int,_unsigned_long>_> *)&local_110,
               (Rational<scp::BigInt<unsigned_int,_unsigned_long>_> *)&local_70);
    scp::Frac<scp::BigInt<unsigned_int,_unsigned_long>_>::operator=
              (&__return_storage_ptr__->super_Frac<scp::BigInt<unsigned_int,_unsigned_long>_>,
               &local_110);
    scp::Frac<scp::BigInt<unsigned_int,_unsigned_long>_>::~Frac(&local_70);
    scp::Frac<scp::BigInt<unsigned_int,_unsigned_long>_>::~Frac(&local_110);
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&eps);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&lim);
  return __return_storage_ptr__;
}

Assistant:

scp::Rational<> squareRoot(uint64_t x, uint64_t n)
{
	int64_t y = 1;
	while (y*y < x)
	{
		++y;
	}

	scp::Rational<> result = { 2 * y + 1, 2 };
	scp::BigInt<> lim = scp::pow(scp::BigInt<>(10), n + 1);
	scp::BigInt<> eps = 2;
	while (eps < lim)
	{
		eps *= eps;
		result = (result*result + x) / (2 * result);
	}

	return result;
}